

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O2

void __thiscall Assimp::DeboneProcess::Execute(DeboneProcess *this,aiScene *pScene)

{
  vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
  *this_00;
  aiMesh *paVar1;
  aiScene *paVar2;
  bool bVar3;
  Logger *pLVar4;
  ulong *puVar5;
  aiMesh **__dest;
  ulong uVar6;
  uint a_1;
  int iVar7;
  uint a;
  uint uVar8;
  ulong uVar9;
  DeboneProcess *this_01;
  reference rVar10;
  aiMesh *srcMesh;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  newMeshes;
  vector<bool,_std::allocator<bool>_> splitList;
  pair<unsigned_int,_aiNode_*> push_pair;
  aiMesh *local_250;
  _Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_> local_248;
  aiScene *local_230;
  _Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
  local_228;
  DeboneProcess *local_208;
  ulong local_200;
  ulong local_1f8;
  char *local_1f0 [4];
  _Bvector_base<std::allocator<bool>_> local_1d0;
  value_type local_1a8 [23];
  
  pLVar4 = DefaultLogger::get();
  Logger::debug(pLVar4,"DeboneProcess begin");
  if ((ulong)pScene->mNumMeshes != 0) {
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_1d0,(ulong)pScene->mNumMeshes,
               (allocator_type *)local_1a8);
    for (uVar9 = 0; uVar6 = (ulong)pScene->mNumMeshes, uVar9 < uVar6; uVar9 = uVar9 + 1) {
      bVar3 = ConsiderMesh(this,pScene->mMeshes[uVar9]);
      rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)&local_1d0,uVar9);
      puVar5 = rVar10._M_p;
      if (bVar3) {
        uVar6 = rVar10._M_mask | *puVar5;
      }
      else {
        uVar6 = ~rVar10._M_mask & *puVar5;
      }
      *puVar5 = uVar6;
    }
    if ((this->mNumBonesCanDoWithout != 0) &&
       ((this->mAllOrNone != true || (this->mNumBonesCanDoWithout == this->mNumBones)))) {
      iVar7 = 0;
      local_230 = pScene;
      local_208 = this;
      for (uVar9 = 0; this_01 = local_208, uVar9 < uVar6; uVar9 = uVar9 + 1) {
        rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&local_1d0,uVar9);
        iVar7 = (iVar7 + 1) - (uint)((rVar10._M_mask & *rVar10._M_p) == 0);
        uVar6 = (ulong)local_230->mNumMeshes;
      }
      if (iVar7 != 0) {
        this_00 = &local_208->mSubMeshIndices;
        std::
        vector<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
        ::resize(this_00,uVar6);
        local_248._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_248._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_248._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        for (uVar9 = 0; paVar2 = local_230, uVar9 < local_230->mNumMeshes; uVar9 = uVar9 + 1) {
          local_250 = local_230->mMeshes[uVar9];
          local_228._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_228._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_228._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             ((vector<bool,_std::allocator<bool>_> *)&local_1d0,uVar9);
          if ((*rVar10._M_p & rVar10._M_mask) != 0) {
            SplitMesh(this_01,local_250,
                      (vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
                       *)&local_228);
          }
          if (local_228._M_impl.super__Vector_impl_data._M_start ==
              local_228._M_impl.super__Vector_impl_data._M_finish) {
            local_1a8[0].first =
                 (uint)((ulong)((long)local_248._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_248._M_impl.super__Vector_impl_data._M_start) >> 3);
            local_1a8[0].second = (aiNode *)0x0;
            std::
            vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
            ::emplace_back<std::pair<unsigned_int,aiNode*>>
                      ((vector<std::pair<unsigned_int,aiNode*>,std::allocator<std::pair<unsigned_int,aiNode*>>>
                        *)((this_00->
                           super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + uVar9),local_1a8);
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                      ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_248,&local_250);
          }
          else {
            local_200 = (ulong)local_250->mNumBones;
            local_1f8 = uVar9;
            for (uVar8 = 0; uVar6 = (ulong)uVar8,
                uVar6 < (ulong)((long)local_228._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_228._M_impl.super__Vector_impl_data._M_start >> 4);
                uVar8 = uVar8 + 1) {
              if (local_228._M_impl.super__Vector_impl_data._M_start[uVar6].second == (aiBone *)0x0)
              {
                local_1a8[0].second = (aiNode *)0x0;
              }
              else {
                local_1a8[0].second =
                     aiNode::FindNode(local_230->mRootNode,
                                      ((local_228._M_impl.super__Vector_impl_data._M_start[uVar6].
                                       second)->mName).data);
              }
              local_1a8[0].first =
                   (uint)((ulong)((long)local_248._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_248._M_impl.super__Vector_impl_data._M_start) >> 3);
              std::
              vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>
              ::push_back((this_00->
                          super__Vector_base<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_aiNode_*>,_std::allocator<std::pair<unsigned_int,_aiNode_*>_>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + uVar9,local_1a8);
              std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                        ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)&local_248,
                         &local_228._M_impl.super__Vector_impl_data._M_start[uVar6].first);
            }
            bVar3 = DefaultLogger::isNullLogger();
            uVar9 = local_1f8;
            this_01 = local_208;
            if (!bVar3) {
              pLVar4 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[31]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [31])"Removed %u bones. Input bones:");
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::operator<<((ostream *)local_1a8,". Output bones: ");
              std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__cxx11::stringbuf::str();
              Logger::info(pLVar4,local_1f0[0]);
              std::__cxx11::string::~string((string *)local_1f0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            }
            paVar1 = local_250;
            if (local_250 != (aiMesh *)0x0) {
              aiMesh::~aiMesh(local_250);
            }
            operator_delete(paVar1,0x520);
          }
          std::
          _Vector_base<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
          ::~_Vector_base(&local_228);
        }
        uVar8 = (uint)((ulong)((long)local_248._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_248._M_impl.super__Vector_impl_data._M_start) >> 3);
        local_230->mNumMeshes = uVar8;
        if (local_230->mMeshes != (aiMesh **)0x0) {
          operator_delete__(local_230->mMeshes);
          uVar8 = paVar2->mNumMeshes;
        }
        __dest = (aiMesh **)operator_new__((ulong)uVar8 << 3);
        paVar2->mMeshes = __dest;
        if ((long)local_248._M_impl.super__Vector_impl_data._M_finish -
            (long)local_248._M_impl.super__Vector_impl_data._M_start != 0) {
          memmove(__dest,local_248._M_impl.super__Vector_impl_data._M_start,
                  (long)local_248._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_248._M_impl.super__Vector_impl_data._M_start);
        }
        UpdateNode(this_01,paVar2->mRootNode);
        std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base(&local_248);
      }
    }
    pLVar4 = DefaultLogger::get();
    Logger::debug(pLVar4,"DeboneProcess end");
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_1d0);
  }
  return;
}

Assistant:

void DeboneProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("DeboneProcess begin");

    if(!pScene->mNumMeshes) {
        return;
    }

    std::vector<bool> splitList(pScene->mNumMeshes);
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++) {
        splitList[a] = ConsiderMesh( pScene->mMeshes[a] );
    }

    int numSplits = 0;

    if(!!mNumBonesCanDoWithout && (!mAllOrNone||mNumBonesCanDoWithout==mNumBones))  {
        for(unsigned int a = 0; a < pScene->mNumMeshes; a++)    {
            if(splitList[a]) {
                numSplits++;
            }
        }
    }

    if(numSplits)   {
        // we need to do something. Let's go.
        //mSubMeshIndices.clear();                  // really needed?
        mSubMeshIndices.resize(pScene->mNumMeshes); // because we're doing it here anyway

        // build a new array of meshes for the scene
        std::vector<aiMesh*> meshes;

        for(unsigned int a=0;a<pScene->mNumMeshes;a++)
        {
            aiMesh* srcMesh = pScene->mMeshes[a];

            std::vector<std::pair<aiMesh*,const aiBone*> > newMeshes;

            if(splitList[a]) {
                SplitMesh(srcMesh,newMeshes);
            }

            // mesh was split
            if(!newMeshes.empty())  {
                unsigned int out = 0, in = srcMesh->mNumBones;

                // store new meshes and indices of the new meshes
                for(unsigned int b=0;b<newMeshes.size();b++)    {
                    const aiString *find = newMeshes[b].second?&newMeshes[b].second->mName:0;

                    aiNode *theNode = find?pScene->mRootNode->FindNode(*find):0;
                    std::pair<unsigned int,aiNode*> push_pair(static_cast<unsigned int>(meshes.size()),theNode);

                    mSubMeshIndices[a].push_back(push_pair);
                    meshes.push_back(newMeshes[b].first);

                    out+=newMeshes[b].first->mNumBones;
                }

                if(!DefaultLogger::isNullLogger()) {
                    ASSIMP_LOG_INFO_F("Removed %u bones. Input bones:", in - out, ". Output bones: ", out);
                }

                // and destroy the source mesh. It should be completely contained inside the new submeshes
                delete srcMesh;
            }
            else    {
                // Mesh is kept unchanged - store it's new place in the mesh array
                mSubMeshIndices[a].push_back(std::pair<unsigned int,aiNode*>(static_cast<unsigned int>(meshes.size()),(aiNode*)0));
                meshes.push_back(srcMesh);
            }
        }

        // rebuild the scene's mesh array
        pScene->mNumMeshes = static_cast<unsigned int>(meshes.size());
        delete [] pScene->mMeshes;
        pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
        std::copy( meshes.begin(), meshes.end(), pScene->mMeshes);

        // recurse through all nodes and translate the node's mesh indices to fit the new mesh array
        UpdateNode( pScene->mRootNode);
    }

    ASSIMP_LOG_DEBUG("DeboneProcess end");
}